

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

void rw::xbox::defaultInstanceCB(Geometry *geo,InstanceDataHeader *header)

{
  uint uVar1;
  uint32 uVar2;
  uint uVar3;
  bool32 bVar4;
  uint32 *puVar5;
  void *pvVar6;
  uint local_40;
  uint local_3c;
  uint local_38;
  int local_34;
  int i;
  uint32 sel;
  uint32 fmt;
  uint8 *dst;
  uint32 *vertexFmt;
  InstanceDataHeader *header_local;
  Geometry *geo_local;
  
  puVar5 = getVertexFmt(geo);
  if (*puVar5 == 0) {
    uVar2 = makeVertexFmt(geo->flags,geo->numTexCoordSets);
    *puVar5 = uVar2;
  }
  uVar2 = getVertexFmtStride(*puVar5);
  header->stride = uVar2;
  pvVar6 = mustmalloc_LOC((long)(header->stride * header->numVertices),0x3000f,
                          "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xbox.cpp line: 322"
                         );
  header->vertexBuffer = pvVar6;
  _sel = (uint8 *)header->vertexBuffer;
  uVar1 = *puVar5;
  uVar3 = uVar1 & 0xf;
  instV3d(*(int *)(v3dFormatMap + (ulong)uVar3 * 4),_sel,geo->morphTargets->vertices,
          header->numVertices,header->stride);
  if (uVar3 == 4) {
    local_38 = 4;
  }
  else {
    local_38 = *(int *)(vertexFormatSizes + (ulong)uVar3 * 4) * 3;
  }
  _sel = _sel + local_38;
  uVar3 = uVar1 >> 4 & 0xf;
  if (uVar3 != 0) {
    instV3d(*(int *)(v3dFormatMap + (ulong)uVar3 * 4),_sel,geo->morphTargets->normals,
            header->numVertices,header->stride);
    if (uVar3 == 4) {
      local_3c = 4;
    }
    else {
      local_3c = *(int *)(vertexFormatSizes + (ulong)uVar3 * 4) * 3;
    }
    _sel = _sel + local_3c;
  }
  if ((uVar1 & 0x1000000) != 0) {
    bVar4 = instColor(10,_sel,geo->colors,header->numVertices,header->stride);
    header->vertexAlpha = bVar4;
    _sel = _sel + 4;
  }
  local_34 = 0;
  while ((local_34 < 4 && (uVar3 = uVar1 >> ((char)(local_34 << 2) + 8U & 0x1f) & 0xf, uVar3 != 0)))
  {
    instTexCoords(*(int *)(v2dFormatMap + (ulong)uVar3 * 4),_sel,geo->texCoords[local_34],
                  header->numVertices,header->stride);
    if (uVar3 == 4) {
      local_40 = 4;
    }
    else {
      local_40 = *(int *)(vertexFormatSizes + (ulong)uVar3 * 4) << 1;
    }
    _sel = _sel + local_40;
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void
defaultInstanceCB(Geometry *geo, InstanceDataHeader *header)
{
	uint32 *vertexFmt = getVertexFmt(geo);
	if(*vertexFmt == 0)
		*vertexFmt = makeVertexFmt(geo->flags, geo->numTexCoordSets);
	header->stride = getVertexFmtStride(*vertexFmt);
	header->vertexBuffer = rwNewT(uint8, header->stride*header->numVertices, MEMDUR_EVENT | ID_GEOMETRY);
	uint8 *dst = (uint8*)header->vertexBuffer;

	uint32 fmt = *vertexFmt;
	uint32 sel = fmt & 0xF;
	instV3d(v3dFormatMap[sel], dst, geo->morphTargets[0].vertices,
	        header->numVertices, header->stride);
	dst += sel == 4 ? 4 : 3*vertexFormatSizes[sel];

	sel = (fmt >> 4) & 0xF;
	if(sel){
		instV3d(v3dFormatMap[sel], dst, geo->morphTargets[0].normals,
		        header->numVertices, header->stride);
		dst += sel == 4 ? 4 : 3*vertexFormatSizes[sel];
	}

	if(fmt & 0x1000000){
		header->vertexAlpha = instColor(VERT_ARGB, dst, geo->colors,
		                                header->numVertices, header->stride);
		dst += 4;
	}

	for(int i = 0; i < 4; i++){
		sel = (fmt >> (i*4 + 8)) & 0xF;
		if(sel == 0)
			break;
		instTexCoords(v2dFormatMap[sel], dst, geo->texCoords[i],
		        header->numVertices, header->stride);
		dst += sel == 4 ? 4 : 2*vertexFormatSizes[sel];
	}

	if(fmt & 0xE000000)
		assert(0 && "can't instance tangents or whatever it is");
}